

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Samplers::CreationTest::iterate(CreationTest *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ContextType ctxType;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *this_03;
  uint local_1cc;
  undefined1 local_1c8 [4];
  GLuint i_1;
  uint local_48;
  GLuint i;
  int local_38 [2];
  GLuint samplers_dsa [2];
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  CreationTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  samplers_dsa[1] = (GLuint)glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,(ApiType)samplers_dsa[1]);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  samplers_dsa[0]._3_1_ =
       glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || ((bool)samplers_dsa[0]._3_1_)) {
    samplers_dsa[0]._2_1_ = 1;
    samplers_dsa[0]._1_1_ = 0;
    local_38[0] = 0;
    local_38[1] = 0;
    (**(code **)(lVar5 + 1000))(2,local_38);
    err = (**(code **)(lVar5 + 0x800))();
    glu::checkError(err,"glCreateSamplers have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                    ,100);
    for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
      cVar2 = (**(code **)(lVar5 + 0xcb0))(samplers_dsa[(ulong)local_48 - 2]);
      if (cVar2 == '\0') {
        samplers_dsa[0]._2_1_ = 0;
        this_01 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        this_02 = tcu::TestContext::getLog(this_01);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_1c8,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
        this_03 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1c8,
                             (char (*) [48])"CreateSamplers has not created defualt objects.");
        tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1c8);
      }
    }
    for (local_1cc = 0; local_1cc < 2; local_1cc = local_1cc + 1) {
      if (samplers_dsa[(ulong)local_1cc - 2] != 0) {
        (**(code **)(lVar5 + 0x468))(1);
        samplers_dsa[(ulong)local_1cc - 2] = 0;
      }
    }
    if ((samplers_dsa[0]._2_1_ & 1) == 0) {
      if ((samplers_dsa[0]._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Samplers objects */
	static const glw::GLuint samplers_count = 2;

	glw::GLuint samplers_dsa[samplers_count] = {};

	try
	{
		/* Check direct state creation. */
		gl.createSamplers(samplers_count, samplers_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateSamplers have failed");

		for (glw::GLuint i = 0; i < samplers_count; ++i)
		{
			if (!gl.isSampler(samplers_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateSamplers has not created defualt objects."
													<< tcu::TestLog::EndMessage;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < samplers_count; ++i)
	{
		if (samplers_dsa[i])
		{
			gl.deleteSamplers(1, &samplers_dsa[i]);

			samplers_dsa[i] = 0;
		}
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}